

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<-24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<-10>,_boost::random::detail::M2<-26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>,_2483442811U>
     ::run(void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_17d0;
  basic_cstring<const_char> local_17c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_17b0;
  assertion_result local_1790;
  basic_cstring<const_char> local_1778;
  basic_cstring<const_char> local_1768;
  basic_cstring<const_char> local_1758;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1748;
  basic_cstring<const_char> local_1720;
  basic_cstring<const_char> local_1710;
  undefined4 local_1700;
  result_type local_16fc;
  basic_cstring<const_char> local_16f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_16e8;
  basic_cstring<const_char> local_16c0;
  basic_cstring<const_char> local_16b0;
  undefined4 local_16a0;
  result_type local_169c;
  basic_cstring<const_char> local_1698;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1688;
  basic_cstring<const_char> local_1660;
  basic_cstring<const_char> local_1650;
  undefined4 local_163c;
  result_type local_1638 [4];
  basic_cstring<const_char> local_1628;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1618;
  basic_cstring<const_char> local_15f0;
  basic_cstring<const_char> local_15e0;
  undefined1 local_15d0 [8];
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>,_2483442811U>
  c;
  
  WellTestCase((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>,_2483442811U>
                *)local_15d0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_15e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_15f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_15e0,0x43,&local_15f0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1618,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1628,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_1638[0] =
         generate((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>,_2483442811U>
                   *)local_15d0);
    local_163c = 0x9406547b;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_1618,&local_1628,0x43,1,2,local_1638,"c.generate()",&local_163c,"Expected");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1618);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1650,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1660);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1650,0x44,&local_1660);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1688,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1698,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_169c = boost::random::
                 well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<-24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<-10>,_boost::random::detail::M2<-26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                 ::min();
    local_16a0 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_1688,&local_1698,0x44,1,2,&local_169c,"c.rng.min()",&local_16a0,"0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1688);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_16b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_16c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_16b0,0x45,&local_16c0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_16e8,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_16f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_16fc = boost::random::
                 well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<-24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<-10>,_boost::random::detail::M2<-26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                 ::max();
    local_1700 = 0xffffffff;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_16e8,&local_16f8,0x45,1,2,&local_16fc,"c.rng.max()",&local_1700,"~0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_16e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1710,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1720);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1710,0x46,&local_1720);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1748,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1758,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::random::well_engine<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,boost::random::detail::M3<_24>,boost::random::detail::M3<30>,boost::random::detail::M3<_10>,boost::random::detail::M2<_26>,boost::random::detail::M1,boost::random::detail::M3<20>,boost::random::detail::M6<32ul,9u,5u,14u,3072982252u>,boost::random::detail::M1,boost::random::detail::matsumoto_kurita_tempering<2480739328u,4195450880u>>,boost::random::well_engine<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,boost::random::detail::M3<_24>,boost::random::detail::M3<30>,boost::random::detail::M3<_10>,boost::random::detail::M2<_26>,boost::random::detail::M1,boost::random::detail::M3<20>,boost::random::detail::M6<32ul,9u,5u,14u,3072982252u>,boost::random::detail::M1,boost::random::detail::matsumoto_kurita_tempering<2480739328u,4195450880u>>>
              (&local_1748,&local_1758,0x46,1,2,local_15d0,"c.rng",local_15d0,"c.rng");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1748);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1768,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1778);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1768,0x47,&local_1778);
    bVar2 = boost::random::operator==
                      ((well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                        *)local_15d0,
                       (well_engine<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_boost::random::detail::M3<_24>,_boost::random::detail::M3<30>,_boost::random::detail::M3<_10>,_boost::random::detail::M2<_26>,_boost::random::detail::M1,_boost::random::detail::M3<20>,_boost::random::detail::M6<32UL,_9U,_5U,_14U,_3072982252U>,_boost::random::detail::M1,_boost::random::detail::matsumoto_kurita_tempering<2480739328U,_4195450880U>_>
                        *)local_15d0);
    boost::test_tools::assertion_result::assertion_result(&local_1790,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_17c0,"c.rng == c.rng",0xe);
    boost::unit_test::operator<<(&local_17b0,plVar3,&local_17c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_17d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion(&local_1790,&local_17b0,&local_17d0,0x47,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_17b0);
    boost::test_tools::assertion_result::~assertion_result(&local_1790);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

static void run()
    {
        WellTestCase c;

        BOOST_CHECK_EQUAL(c.generate(), Expected);
        BOOST_CHECK_EQUAL(c.rng.min(), 0U);
        BOOST_CHECK_EQUAL(c.rng.max(), ~0U);
        BOOST_CHECK_EQUAL(c.rng, c.rng);
        BOOST_CHECK(c.rng == c.rng);
    }